

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directives.cpp
# Opt level: O0

void dirSLOT(void)

{
  bool bVar1;
  int iVar2;
  char local_818 [8];
  char buf [2048];
  aint local_c [2];
  aint val;
  
  if (DeviceID == (char *)0x0) {
    Warning("SLOT only allowed in real device emulation mode (See DEVICE)",(char *)0x0,W_PASS3);
    SkipParam(&lp);
  }
  else {
    iVar2 = ParseExpressionNoSyntaxError(&lp,local_c);
    if (iVar2 == 0) {
      Error("[SLOT] Syntax error in <slot_number>",lp,SUPPRESS);
    }
    else {
      local_c[0] = CDevice::SlotNumberFromPreciseAddress(Device,local_c[0]);
      bVar1 = CDevice::SetSlot(Device,local_c[0]);
      if (!bVar1) {
        snprintf(local_818,0x800,
                 "[SLOT] Slot number must be in range 0..%u, or exact starting address of slot",
                 (ulong)(Device->SlotsCount - 1));
        Error(local_818,(char *)0x0,IF_FIRST);
      }
    }
  }
  return;
}

Assistant:

static void dirSLOT() {
	aint val;
	if (!DeviceID) {
		Warning("SLOT only allowed in real device emulation mode (See DEVICE)");
		SkipParam(lp);
		return;
	}
	if (!ParseExpressionNoSyntaxError(lp, val)) {
		Error("[SLOT] Syntax error in <slot_number>", lp, SUPPRESS);
		return;
	}
	val = Device->SlotNumberFromPreciseAddress(val);
	if (!Device->SetSlot(val)) {
		char buf[LINEMAX];
		SPRINTF1(buf, LINEMAX, "[SLOT] Slot number must be in range 0..%u, or exact starting address of slot", Device->SlotsCount - 1);
		Error(buf, NULL, IF_FIRST);
	}
}